

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_chart_end(nk_context *ctx)

{
  long in_RDI;
  nk_chart *chart;
  nk_window *win;
  
  if ((in_RDI != 0) && (*(long *)(in_RDI + 0x40d8) != 0)) {
    nk_memset((void *)(*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) + 0xf8),0,0xb4);
  }
  return;
}

Assistant:

NK_API void
nk_chart_end(struct nk_context *ctx)
{
struct nk_window *win;
struct nk_chart *chart;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current)
return;

win = ctx->current;
chart = &win->layout->chart;
NK_MEMSET(chart, 0, sizeof(*chart));
return;
}